

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

art_indexed_child_t art_node4_prev_child(art_node4_t *node,int index)

{
  art_indexed_child_t aVar1;
  int iVar2;
  int index_local;
  art_node4_t *node_local;
  art_indexed_child_t indexed_child;
  
  index_local = index;
  if ((int)(uint)(node->field_0).field_0.count < index) {
    index_local = (int)(node->field_0).field_0.count;
  }
  iVar2 = index_local + -1;
  if (iVar2 < 0) {
    indexed_child.child = 0;
  }
  else {
    indexed_child.index = (uint8_t)iVar2;
    indexed_child.child = *(art_ref_t *)((long)&node->field_0 + (long)iVar2 * 8 + 0x10);
    indexed_child.key_chunk = *(art_key_chunk_t *)((long)&node->field_0 + (long)iVar2 + 7);
  }
  aVar1.index = indexed_child.index;
  aVar1.child = indexed_child.child;
  aVar1.key_chunk = indexed_child.key_chunk;
  aVar1._10_6_ = indexed_child._10_6_;
  return aVar1;
}

Assistant:

static inline art_indexed_child_t art_node4_prev_child(const art_node4_t *node,
                                                       int index) {
    if (index > node->count) {
        index = node->count;
    }
    index--;
    art_indexed_child_t indexed_child;
    if (index < 0) {
        indexed_child.child = CROARING_ART_NULL_REF;
        return indexed_child;
    }
    indexed_child.index = index;
    indexed_child.child = node->children[index];
    indexed_child.key_chunk = node->keys[index];
    return indexed_child;
}